

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_strings.c
# Opt level: O1

void cubeb_strings_destroy(cubeb_strings *strings)

{
  uint uVar1;
  char **ppcVar2;
  void *__ptr;
  long lVar3;
  
  if (strings != (cubeb_strings *)0x0) {
    uVar1 = strings->count;
    if ((ulong)uVar1 != 0) {
      ppcVar2 = strings->data;
      lVar3 = 0;
      do {
        __ptr = *(void **)((long)ppcVar2 + lVar3);
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        lVar3 = lVar3 + 8;
      } while ((ulong)uVar1 << 3 != lVar3);
    }
    if (strings->data != strings->small_store) {
      free(strings->data);
    }
    free(strings);
    return;
  }
  return;
}

Assistant:

void
cubeb_strings_destroy(cubeb_strings * strings)
{
  char ** sp = NULL;
  char ** se = NULL;

  if (!strings) {
    return;
  }

  sp = strings->data;
  se = sp + strings->count;

  for ( ;  sp != se; sp++) {
    if (*sp) {
      free(*sp);
    }
  }

  if (strings->data != strings->small_store) {
    free(strings->data);
  }

  free(strings);
}